

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O1

uint64_t assembler::anon_unknown_0::fill_vm_bytecode(instruction *instr,uint8_t *opcode_stream)

{
  operation oVar1;
  int iVar2;
  uint64_t uVar3;
  long lVar4;
  uint8_t op1mem;
  uint8_t op2mem;
  bool savemem2;
  bool savemem1;
  bool savemem;
  uint8_t local_35;
  uint8_t local_34;
  bool local_33;
  bool local_32;
  bool local_31;
  
  oVar1 = instr->oper;
  if (((ulong)oVar1 < 0x40) && ((0xc000010000000200U >> ((ulong)oVar1 & 0x3f) & 1) != 0)) {
    uVar3 = 0;
  }
  else {
    *opcode_stream = (uint8_t)oVar1;
    iVar2 = number_of_operands(&instr->oper);
    if (iVar2 == 2) {
      get_memory_size_type(&local_35,&local_32,&instr->oper,&instr->operand1,instr->operand1_mem);
      get_memory_size_type(&local_34,&local_33,&instr->oper,&instr->operand2,instr->operand2_mem);
      opcode_stream[1] = (char)instr->operand1;
      opcode_stream[2] = (char)instr->operand2;
      uVar3 = 4;
      lVar4 = 3;
    }
    else {
      if (iVar2 != 1) {
        return 1;
      }
      get_memory_size_type(&local_35,&local_31,&instr->oper,&instr->operand1,instr->operand1_mem);
      opcode_stream[1] = (char)instr->operand1;
      uVar3 = 3;
      lVar4 = 2;
    }
    opcode_stream[lVar4] = '\0';
  }
  return uVar3;
}

Assistant:

uint64_t fill_vm_bytecode(const asmcode::instruction& instr, uint8_t* opcode_stream)
    {
    uint64_t sz = 0;
    if (ignore_operation_as_bytecode(instr.oper))
      return sz;
    opcode_stream[sz++] = (uint8_t)instr.oper;
    uint8_t op1mem = 0;
    uint8_t op2mem = 0;
    int nr_ops = number_of_operands(instr.oper);
    if (nr_ops == 1)
      {
      bool savemem = true;
      get_memory_size_type(op1mem, savemem, instr.oper, instr.operand1, instr.operand1_mem);
      if (savemem)
        {
        opcode_stream[sz++] = (uint8_t)instr.operand1;
        opcode_stream[sz++] = op1mem;
        }
      else
        {
        opcode_stream[sz++] = (uint8_t)instr.operand1 | operand_has_8bit_mem;
        }
      }
    else if (nr_ops == 2)
      {
      bool savemem1 = true;
      bool savemem2 = true;
      get_memory_size_type(op1mem, savemem1, instr.oper, instr.operand1, instr.operand1_mem);
      get_memory_size_type(op2mem, savemem2, instr.oper, instr.operand2, instr.operand2_mem);
      if (savemem1 || savemem2)
        {
        opcode_stream[sz++] = (uint8_t)instr.operand1;
        opcode_stream[sz++] = (uint8_t)instr.operand2;
        opcode_stream[sz++] = (uint8_t)(op2mem << 4) | op1mem;
        }
      else
        {
        opcode_stream[sz++] = (uint8_t)instr.operand1 | operand_has_8bit_mem;
        opcode_stream[sz++] = (uint8_t)instr.operand2 | operand_has_8bit_mem;
        }
      }
    switch (op1mem)
      {
      case 1: opcode_stream[sz++] = (uint8_t)instr.operand1_mem; break;
      case 2: *(reinterpret_cast<uint16_t*>(opcode_stream + sz)) = (uint16_t)instr.operand1_mem; sz += 2; break;
      case 3: *(reinterpret_cast<uint32_t*>(opcode_stream + sz)) = (uint32_t)instr.operand1_mem; sz += 4; break;
      case 4: *(reinterpret_cast<uint64_t*>(opcode_stream + sz)) = (uint64_t)instr.operand1_mem; sz += 8; break;
      default: break;
      }
    switch (op2mem)
      {
      case 1: opcode_stream[sz++] = (uint8_t)instr.operand2_mem; break;
      case 2: *(reinterpret_cast<uint16_t*>(opcode_stream + sz)) = (uint16_t)instr.operand2_mem; sz += 2; break;
      case 3: *(reinterpret_cast<uint32_t*>(opcode_stream + sz)) = (uint32_t)instr.operand2_mem; sz += 4; break;
      case 4: *(reinterpret_cast<uint64_t*>(opcode_stream + sz)) = (uint64_t)instr.operand2_mem; sz += 8; break;
      default: break;
      }
    return sz;
    /*
    switch (instr.oper)
      {
      case asmcode::LABEL: return 0;
      case asmcode::LABEL_ALIGNED: return 0;
      case asmcode::GLOBAL: return 0;
      case asmcode::COMMENT: return 0;
      case asmcode::NOP:
      {
      opcode_stream[0] = (uint8_t)instr.oper;
      return 1;
      }
      default: break;
      }
    opcode_stream[0] = (uint8_t)instr.oper;
    opcode_stream[1] = (uint8_t)instr.operand1;
    opcode_stream[2] = (uint8_t)instr.operand2;
    uint8_t op1mem = 0;
    uint8_t op2mem = 0;
    if (instr.operand1_mem != 0)
      {
      if (is_8_bit(instr.operand1_mem))
        op1mem = 1;
      else if (is_16_bit(instr.operand1_mem))
        op1mem = 2;
      else if (is_32_bit(instr.operand1_mem))
        op1mem = 3;
      else
        op1mem = 4;
      }
    if (op1mem < 4)
      {
      if (instr.operand1 == asmcode::LABELADDRESS)
        op1mem = 4;
      }
    if (op1mem < 3)
      {
      if (instr.oper == asmcode::CALL)
        op1mem = 3;
      if (instr.oper == asmcode::JMP)
        op1mem = 3;
      if (instr.oper == asmcode::JA)
        op1mem = 3;
      if (instr.oper == asmcode::JB)
        op1mem = 3;
      if (instr.oper == asmcode::JE)
        op1mem = 3;
      if (instr.oper == asmcode::JL)
        op1mem = 3;
      if (instr.oper == asmcode::JLE)
        op1mem = 3;
      if (instr.oper == asmcode::JG)
        op1mem = 3;
      if (instr.oper == asmcode::JGE)
        op1mem = 3;
      if (instr.oper == asmcode::JNE)
        op1mem = 3;
      }
    if (instr.operand2_mem != 0)
      {
      if (is_8_bit(instr.operand2_mem))
        op2mem = 1;
      else if (is_16_bit(instr.operand2_mem))
        op2mem = 2;
      else if (is_32_bit(instr.operand2_mem))
        op2mem = 3;
      else
        op2mem = 4;
      }
    if (op2mem < 4)
      {
      if (instr.operand2 == asmcode::LABELADDRESS)
        op2mem = 4;
      }
    opcode_stream[3] = (uint8_t)(op2mem << 4) | op1mem;
    uint64_t sz = 4;
    switch (op1mem)
      {
      case 1: opcode_stream[sz++] = (uint8_t)instr.operand1_mem; break;
      case 2: *(reinterpret_cast<uint16_t*>(opcode_stream + sz)) = (uint16_t)instr.operand1_mem; sz += 2; break;
      case 3: *(reinterpret_cast<uint32_t*>(opcode_stream + sz)) = (uint32_t)instr.operand1_mem; sz += 4; break;
      case 4: *(reinterpret_cast<uint64_t*>(opcode_stream + sz)) = (uint64_t)instr.operand1_mem; sz += 8; break;
      default: break;
      }
    switch (op2mem)
      {
      case 1: opcode_stream[sz++] = (uint8_t)instr.operand2_mem; break;
      case 2: *(reinterpret_cast<uint16_t*>(opcode_stream + sz)) = (uint16_t)instr.operand2_mem; sz += 2; break;
      case 3: *(reinterpret_cast<uint32_t*>(opcode_stream + sz)) = (uint32_t)instr.operand2_mem; sz += 4; break;
      case 4: *(reinterpret_cast<uint64_t*>(opcode_stream + sz)) = (uint64_t)instr.operand2_mem; sz += 8; break;
      default: break;
      }

    return sz;
    */
    }